

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t exr_attr_string_destroy(exr_context_t ctxt,exr_attr_string_t *s)

{
  undefined8 *in_RSI;
  long in_RDI;
  exr_attr_string_t nil;
  _internal_exr_context *pctxt;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  undefined8 *local_18;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (undefined8 *)0x0) {
      local_20 = in_RDI;
      local_18 = in_RSI;
      memset(&local_30,0,0x10);
      if ((local_18[1] != 0) && (0 < *(int *)((long)local_18 + 4))) {
        (**(code **)(local_20 + 0x60))(local_18[1]);
      }
      *local_18 = local_30;
      local_18[1] = local_28;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_destroy (exr_context_t ctxt, exr_attr_string_t* s)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (s)
    {
        exr_attr_string_t nil = {0};
        if (s->str && s->alloc_size > 0)
            pctxt->free_fn ((char*) (uintptr_t) s->str);
        *s = nil;
    }
    return EXR_ERR_SUCCESS;
}